

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

KUINT16 __thiscall KDIS::DATA_TYPE::Mine::GetLength(Mine *this)

{
  KBOOL KVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  _Self local_28;
  const_iterator citrMEnd;
  const_iterator citrM;
  KUINT16 ui16Len;
  Mine *this_local;
  
  citrM._M_node._6_2_ = 0xe;
  KVar1 = MinefieldDataFilter::IsGroundBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = 0x12;
  }
  KVar1 = MinefieldDataFilter::IsWaterBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 4;
  }
  KVar1 = MinefieldDataFilter::IsSnowBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 4;
  }
  KVar1 = MinefieldDataFilter::IsMineOrientation(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 0xc;
  }
  KVar1 = MinefieldDataFilter::IsThermalContrast(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 4;
  }
  KVar1 = MinefieldDataFilter::IsReflectance(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 4;
  }
  KVar1 = MinefieldDataFilter::IsMineEmplacementAge(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 8;
  }
  KVar1 = MinefieldDataFilter::IsFusing(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 2;
  }
  KVar1 = MinefieldDataFilter::IsScalarDetectionCoefficient(&this->super_MinefieldDataFilter);
  if (KVar1) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_vui8SDC);
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + (short)sVar4;
  }
  KVar1 = MinefieldDataFilter::IsPaintScheme(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 1;
  }
  KVar1 = MinefieldDataFilter::IsTripDetonationWire(&this->super_MinefieldDataFilter);
  if (KVar1) {
    citrM._M_node._6_2_ = citrM._M_node._6_2_ + 1;
    citrMEnd = std::
               map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
               ::begin(&this->m_mvVertices);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
         ::end(&this->m_mvVertices);
    while (bVar2 = std::operator!=(&citrMEnd,&local_28), bVar2) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
               ::operator->(&citrMEnd);
      sVar4 = std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::size
                        (&ppVar3->second);
      citrM._M_node._6_2_ = citrM._M_node._6_2_ + (short)sVar4 * 0xc;
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
      ::operator++(&citrMEnd);
    }
  }
  return citrM._M_node._6_2_;
}

Assistant:

KUINT16 Mine::GetLength() const
{
    KUINT16 ui16Len = 14; // Min Size

    if( IsGroundBurialDepthOffset() )       ui16Len += 4;
    if( IsWaterBurialDepthOffset() )        ui16Len += 4;
    if( IsSnowBurialDepthOffset() )         ui16Len += 4;
    if( IsMineOrientation() )               ui16Len += m_Ori.EULER_ANGLES_SIZE;
    if( IsThermalContrast() )               ui16Len += 4;
    if( IsReflectance() )                   ui16Len += 4;
    if( IsMineEmplacementAge() )            ui16Len += m_MET.CLOCK_TIME_SIZE;
    if( IsFusing() )                        ui16Len += m_MF.MINE_FUSING_SIZE;
    if( IsScalarDetectionCoefficient() )    ui16Len += 1 * m_vui8SDC.size();
    if( IsPaintScheme() )                   ui16Len += m_MPS.MINE_PAINT_SCHEME_SIZE;
    if( IsTripDetonationWire() )
    {
        ++ui16Len;
        map< KUINT16, vector<Vector> >::const_iterator citrM = m_mvVertices.begin();
        map< KUINT16, vector<Vector> >::const_iterator citrMEnd = m_mvVertices.end();
        for( ; citrM != citrMEnd; ++citrM )
        {
            ui16Len += citrM->second.size() * Vector::VECTOR_SIZE;
        }
    }

    return ui16Len;
}